

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceAtomicOperations_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType memDataType,DataType dataDataType,
          DataType compareDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  ostream *poVar5;
  string *psVar6;
  ShaderType shaderType_00;
  ostringstream source;
  string *local_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [6];
  string local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  string local_340;
  string local_320 [3];
  ios_base local_2b0 [264];
  long local_1a8 [47];
  
  shaderType_00 = shaderType;
  local_3c8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x220);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  getShaderInitialization_abi_cxx11_
            (&local_340,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_340._M_dataplus._M_p,local_340._M_string_length);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"mem","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"buffer SSBO {\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"    ",4);
  pcVar2 = glu::getDataTypeName(function);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_320[0]._M_dataplus._M_p + -0x18) +
                    0xa8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(char *)local_3c0,local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"};\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_360,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tmediump ",9);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"data","");
  anon_unknown_0::declareAndInitializeShaderVariable(local_320,memDataType,&local_380);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  psVar6 = (string *)
           (*(code *)(&DAT_009bb1a0 + *(int *)(&DAT_009bb1a0 + (ulong)(shaderType - 0x10) * 4)))();
  return psVar6;
}

Assistant:

std::string genShaderSourceAtomicOperations (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType memDataType, glu::DataType dataDataType, glu::DataType compareDataType)
{
	DE_ASSERT(SHADER_FUNCTION_ATOMIC_ADD <= function && function <= SHADER_FUNCTION_ATOMIC_COMP_SWAP);

	std::ostringstream source;

	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< declareBuffer(memDataType, "mem")
			<< "void main()\n"
			<< "{\n"
			<< "	mediump " << declareAndInitializeShaderVariable(dataDataType, "data");

	switch (function)
	{
		case SHADER_FUNCTION_ATOMIC_ADD:		source << "    atomicAdd(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_MIN:		source << "    atomicMin(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_MAX:		source << "    atomicMax(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_AND:		source << "    atomicAnd(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_OR:			source << "    atomicOr(mem, data);\n";			break;
		case SHADER_FUNCTION_ATOMIC_XOR:		source << "    atomicXor(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_EXCHANGE:	source << "    atomicExchange(mem, data);\n";	break;
		case SHADER_FUNCTION_ATOMIC_COMP_SWAP:
			source	<< "	mediump " << declareAndInitializeShaderVariable(compareDataType, "compare")
					<< "    atomicCompSwap(mem, compare, data);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}